

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_1190e7c::cmDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmDirectoryListGenerator *this,string *parent)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  unsigned_long uVar6;
  string *psVar7;
  pointer pbVar8;
  ulong dindex;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  char *fname;
  string name;
  Directory directoryLister;
  char *local_d0;
  string *local_c8;
  string *local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  basic_string_view<char,_std::char_traits<char>_> local_90;
  long local_80;
  undefined1 *local_78;
  size_type local_70;
  pointer local_68;
  Directory local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  pbVar8 = (this->Matches).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->Matches).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == pbVar8) {
    local_c0 = __return_storage_ptr__;
    cmsys::Directory::Directory(&local_60);
    local_c8 = parent;
    cmsys::Directory::Load(&local_60,parent,(string *)0x0);
    local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Matches;
    dindex = 0;
    while( true ) {
      uVar6 = cmsys::Directory::GetNumberOfFiles(&local_60);
      if (uVar6 <= dindex) break;
      local_d0 = cmsys::Directory::GetFile(&local_60,dindex);
      bVar4 = isDirentryToIgnore(local_d0);
      if (!bVar4) {
        pvVar1 = (this->Names)._M_data;
        pbVar2 = (pvVar1->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar8 = (pvVar1->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
            pbVar8 = pbVar8 + 1) {
          pcVar3 = (pbVar8->_M_dataplus)._M_p;
          local_b0[0] = local_a0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b0,pcVar3,pcVar3 + pbVar8->_M_string_length);
          (*this->_vptr_cmDirectoryListGenerator[3])(&local_90,this,(string *)local_b0);
          if (local_b0[0] != local_a0) {
            operator_delete(local_b0[0],local_a0[0] + 1);
          }
          iVar5 = cmsysString_strncasecmp(local_d0,(char *)local_90._M_len,(size_t)local_90._M_str);
          if (iVar5 == 0) {
            bVar4 = cmsys::Directory::FileIsDirectory(&local_60,dindex);
            if (bVar4) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*const&>(local_b8,&local_d0);
            }
          }
          if ((long *)local_90._M_len != &local_80) {
            operator_delete((void *)local_90._M_len,local_80 + 1);
          }
        }
      }
      dindex = dindex + 1;
    }
    (*this->_vptr_cmDirectoryListGenerator[2])(this);
    (this->Current)._M_current =
         (this->Matches).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    cmsys::Directory::~Directory(&local_60);
    pbVar8 = (this->Matches).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    parent = local_c8;
    __return_storage_ptr__ = local_c0;
  }
  pbVar2 = (this->Current)._M_current;
  if (pbVar2 == pbVar8) {
    psVar7 = (string *)&__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar7;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_90._M_str = (parent->_M_dataplus)._M_p;
    local_90._M_len = parent->_M_string_length;
    local_78 = local_50;
    local_60.Internal = (DirectoryInternals *)0x1;
    local_50[0] = 0x2f;
    (this->Current)._M_current = pbVar2 + 1;
    local_80 = 1;
    local_68 = (pbVar2->_M_dataplus)._M_p;
    local_70 = pbVar2->_M_string_length;
    views._M_len = 3;
    views._M_array = &local_90;
    local_58 = local_78;
    psVar7 = cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  return psVar7;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    // Construct a list of matches if not yet
    if (this->Matches.empty()) {
      cmsys::Directory directoryLister;
      // ALERT `Directory::Load()` keeps only names
      // internally and LOST entry type from `dirent`.
      // So, `Directory::FileIsDirectory` gonna use
      // `SystemTools::FileIsDirectory()` and waste a syscall.
      // TODO Need to enhance the `Directory` class.
      directoryLister.Load(parent);

      // ATTENTION Is it guaranteed that first two entries are
      // `.` and `..`?
      // TODO If so, just start with index 2 and drop the
      // `isDirentryToIgnore(i)` condition to check.
      for (auto i = 0ul; i < directoryLister.GetNumberOfFiles(); ++i) {
        const char* const fname = directoryLister.GetFile(i);
        if (isDirentryToIgnore(fname)) {
          continue;
        }

        for (const auto& n : this->Names.get()) {
          // NOTE Customization point for `cmMacProjectDirectoryListGenerator`
          const auto name = this->TransformNameBeforeCmp(n);
          // Skip entries that don't match and non-directories.
          // ATTENTION BTW, original code also didn't check if it's a symlink
          // to a directory!
          const auto equal =
            (cmsysString_strncasecmp(fname, name.c_str(), name.length()) == 0);
          if (equal && directoryLister.FileIsDirectory(i)) {
            this->Matches.emplace_back(fname);
          }
        }
      }
      // NOTE Customization point for `cmProjectDirectoryListGenerator`
      this->OnMatchesLoaded();

      this->Current = this->Matches.cbegin();
    }

    if (this->Current != this->Matches.cend()) {
      auto candidate = cmStrCat(parent, '/', *this->Current++);
      return candidate;
    }

    return {};
  }